

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

SliceStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_slicestatic(NeuralNetworkLayer *this)

{
  SliceStaticLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x3e3) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3e3;
    this_00 = (SliceStaticLayerParams *)operator_new(0xa0);
    SliceStaticLayerParams::SliceStaticLayerParams(this_00);
    (this->layer_).slicestatic_ = this_00;
  }
  return (SliceStaticLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SliceStaticLayerParams* NeuralNetworkLayer::mutable_slicestatic() {
  if (!has_slicestatic()) {
    clear_layer();
    set_has_slicestatic();
    layer_.slicestatic_ = new ::CoreML::Specification::SliceStaticLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.sliceStatic)
  return layer_.slicestatic_;
}